

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O1

void __thiscall duckdb_shell::ModeJsonRenderer::RenderRow(ModeJsonRenderer *this,RowResult *result)

{
  pointer piVar1;
  pointer piVar2;
  int iVar3;
  char *z;
  ShellState *pSVar4;
  ulong uVar5;
  
  if ((result->column_names).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      (result->column_names).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
      .super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      if (uVar5 != 0) {
        ShellState::Print((this->super_RowRenderer).super_ShellRenderer.state,",");
      }
      ShellState::OutputJSONString
                ((this->super_RowRenderer).super_ShellRenderer.state,
                 (result->column_names).
                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5],-1);
      ShellState::Print((this->super_RowRenderer).super_ShellRenderer.state,":");
      z = (result->data).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5];
      if (z == (char *)0x0) {
LAB_0021d240:
        pSVar4 = (this->super_RowRenderer).super_ShellRenderer.state;
LAB_0021d244:
        z = "null";
LAB_0021d317:
        ShellState::Print(pSVar4,z);
      }
      else {
        piVar1 = (result->types).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2 = (result->types).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (piVar1 == piVar2) {
LAB_0021d310:
          pSVar4 = (this->super_RowRenderer).super_ShellRenderer.state;
          goto LAB_0021d317;
        }
        if (piVar1[uVar5] == 5) goto LAB_0021d240;
        if (piVar1 == piVar2) goto LAB_0021d310;
        if (piVar1[uVar5] == 2) {
          iVar3 = strcmp(z,"inf");
          if (iVar3 == 0) {
            pSVar4 = (this->super_RowRenderer).super_ShellRenderer.state;
            z = "1e999";
          }
          else {
            iVar3 = strcmp(z,"-inf");
            if (iVar3 != 0) {
              iVar3 = strcmp(z,"nan");
              if (iVar3 == 0) goto LAB_0021d240;
              iVar3 = strcmp(z,"-nan");
              pSVar4 = (this->super_RowRenderer).super_ShellRenderer.state;
              if (iVar3 != 0) goto LAB_0021d317;
              goto LAB_0021d244;
            }
            pSVar4 = (this->super_RowRenderer).super_ShellRenderer.state;
            z = "-1e999";
          }
          goto LAB_0021d317;
        }
        if (piVar1 == piVar2) goto LAB_0021d310;
        if ((piVar1[uVar5] == 4) && (result->pStmt != (sqlite3_stmt *)0x0)) {
          z = (char *)duckdb_shell_sqlite3_column_blob(result->pStmt,(int)uVar5);
          iVar3 = duckdb_shell_sqlite3_column_bytes(result->pStmt,(int)uVar5);
          pSVar4 = (this->super_RowRenderer).super_ShellRenderer.state;
        }
        else {
          if ((piVar1 == piVar2) || (piVar1[uVar5] != 3)) goto LAB_0021d310;
          pSVar4 = (this->super_RowRenderer).super_ShellRenderer.state;
          iVar3 = -1;
        }
        ShellState::OutputJSONString(pSVar4,z,iVar3);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(result->column_names).
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(result->column_names).
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ShellState::Print((this->super_RowRenderer).super_ShellRenderer.state,"}");
  return;
}

Assistant:

void RenderRow(RowResult &result) override {
		auto &data = result.data;
		auto &types = result.types;
		auto &col_names = result.column_names;
		for (idx_t i = 0; i < col_names.size(); i++) {
			if (i > 0) {
				state.Print(",");
			}
			state.OutputJSONString(col_names[i], -1);
			state.Print(":");
			if ((data[i] == 0) || (!types.empty() && types[i] == SQLITE_NULL)) {
				state.Print("null");
			} else if (!types.empty() && types[i] == SQLITE_FLOAT) {
				if (strcmp(data[i], "inf") == 0) {
					state.Print("1e999");
				} else if (strcmp(data[i], "-inf") == 0) {
					state.Print("-1e999");
				} else if (strcmp(data[i], "nan") == 0) {
					state.Print("null");
				} else if (strcmp(data[i], "-nan") == 0) {
					state.Print("null");
				} else {
					state.Print(data[i]);
				}
			} else if (!types.empty() && types[i] == SQLITE_BLOB && result.pStmt) {
				const void *pBlob = sqlite3_column_blob(result.pStmt, i);
				int nBlob = sqlite3_column_bytes(result.pStmt, i);
				state.OutputJSONString((const char *)pBlob, nBlob);
			} else if (!types.empty() && types[i] == SQLITE_TEXT) {
				state.OutputJSONString(data[i], -1);
			} else {
				state.Print(data[i]);
			}
		}
		state.Print("}");
	}